

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZFMatrix<double>_>::TPZVec
          (TPZVec<TPZFMatrix<double>_> *this,int64_t size,TPZFMatrix<double> *copy)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong *puVar3;
  TPZFMatrix<double> *pTVar4;
  TPZFMatrix<double> *pTVar5;
  TPZFMatrix<double> *in_RSI;
  undefined8 *in_RDI;
  ulong uVar6;
  int64_t i;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  TPZFMatrix<double> *in_stack_ffffffffffffff98;
  TPZFMatrix<double> *local_60;
  TPZFMatrix<double> *this_00;
  long local_30;
  
  *in_RDI = &PTR__TPZVec_0245d4a8;
  in_RDI[1] = 0;
  if ((long)in_RSI < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "TPZVec<TPZFMatrix<double>>::TPZVec(const int64_t, const T &) [T = TPZFMatrix<double>]"
                   );
    std::operator<<((ostream *)&std::cerr,"Bad parameter size, then size = 0.\n");
    std::ostream::flush();
    in_RDI[2] = 0;
    in_RDI[3] = 0;
  }
  else {
    if (in_RSI != (TPZFMatrix<double> *)0x0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(0x90),0);
      uVar6 = uVar2 + 8;
      if (SUB168(auVar1 * ZEXT816(0x90),8) != 0 || 0xfffffffffffffff7 < uVar2) {
        uVar6 = 0xffffffffffffffff;
      }
      this_00 = in_RSI;
      puVar3 = (ulong *)operator_new__(uVar6);
      *puVar3 = (ulong)this_00;
      pTVar5 = (TPZFMatrix<double> *)(puVar3 + 1);
      if (this_00 != (TPZFMatrix<double> *)0x0) {
        in_stack_ffffffffffffff98 = pTVar5 + (long)this_00;
        local_60 = pTVar5;
        do {
          TPZFMatrix<double>::TPZFMatrix(this_00);
          pTVar4 = local_60 + 1;
          in_stack_ffffffffffffff90 = local_60;
          local_60 = pTVar4;
        } while (pTVar4 != in_stack_ffffffffffffff98);
      }
      in_RDI[1] = pTVar5;
    }
    in_RDI[2] = in_RSI;
    in_RDI[3] = in_RSI;
    for (local_30 = 0; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      TPZFMatrix<double>::operator=(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  return;
}

Assistant:

TPZVec<T>::TPZVec( const int64_t size, const T& copy ) : fStore( nullptr )
{
#ifndef PZNODEBUG
	if( size < 0 )
	{
		PZError << __PRETTY_FUNCTION__;
        PZError << "Bad parameter size, then size = 0.\n";
		PZError.flush();
		fNElements = 0;
        fNAlloc = 0;
		return;
	}
#endif
	
	if( size )
	{
		fStore = new T[size];
	}
	
	fNElements = size;
    fNAlloc = size;
	
	for( int64_t i = 0; i < size; i++ )
	{
		fStore[i] = copy;
	}
}